

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

opj_bool j2k_read_mct(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                     opj_event_mgr *p_manager)

{
  OPJ_UINT32 OVar1;
  opj_mct_data_t *poVar2;
  OPJ_BYTE *pOVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 OVar5;
  char *fmt;
  opj_bool oVar6;
  opj_tcp_v2_t *poVar7;
  uint uVar8;
  opj_mct_data_t *poVar9;
  uint uVar10;
  OPJ_UINT32 l_tmp;
  uint local_3c;
  OPJ_BYTE *local_38;
  
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar7 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar7 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size < 2) {
LAB_001ef33b:
    oVar6 = 0;
    opj_event_msg_v2(p_manager,1,"Error reading MCT marker\n");
  }
  else {
    opj_read_bytes_LE(p_header_data,&local_3c,2);
    if (local_3c == 0) {
      if (p_header_size < 7) goto LAB_001ef33b;
      opj_read_bytes_LE(p_header_data + 2,&local_3c,2);
      poVar2 = poVar7->m_mct_records;
      OVar1 = poVar7->m_nb_mct_records;
      OVar4 = 0;
      uVar10 = local_3c & 0xff;
      poVar9 = poVar2;
      OVar5 = OVar4;
      if (OVar1 != 0) {
        do {
          OVar5 = OVar4;
          if (poVar9->m_index == uVar10) break;
          poVar9 = poVar9 + 1;
          OVar4 = OVar4 + 1;
          OVar5 = OVar1;
        } while (OVar1 != OVar4);
      }
      if (OVar5 == OVar1) {
        if (OVar1 == poVar7->m_nb_max_mct_records) {
          uVar8 = poVar7->m_nb_max_mct_records + 10;
          poVar7->m_nb_max_mct_records = uVar8;
          poVar2 = (opj_mct_data_t *)realloc(poVar2,(ulong)uVar8 << 5);
          poVar7->m_mct_records = poVar2;
          if (poVar2 == (opj_mct_data_t *)0x0) goto LAB_001ef33b;
          memset(poVar2 + poVar7->m_nb_mct_records,0,
                 (ulong)(poVar7->m_nb_max_mct_records - poVar7->m_nb_mct_records) << 5);
        }
        poVar9 = poVar7->m_mct_records + poVar7->m_nb_mct_records;
      }
      pOVar3 = p_header_data + 4;
      if (poVar9->m_data != (OPJ_BYTE *)0x0) {
        local_38 = p_header_data + 4;
        free(poVar9->m_data);
        poVar9->m_data = (OPJ_BYTE *)0x0;
        pOVar3 = local_38;
      }
      poVar9->m_index = uVar10;
      poVar9->m_array_type = local_3c >> 8 & (MCT_TYPE_OFFSET|MCT_TYPE_DECORRELATION);
      poVar9->m_element_type = local_3c >> 10 & MCT_TYPE_DOUBLE;
      opj_read_bytes_LE(pOVar3,&local_3c,2);
      if (local_3c != 0) {
        fmt = "Cannot take in charge multiple MCT markers\n";
        goto LAB_001ef378;
      }
      uVar10 = p_header_size - 6;
      pOVar3 = (OPJ_BYTE *)malloc((ulong)uVar10);
      poVar9->m_data = pOVar3;
      if (pOVar3 == (OPJ_BYTE *)0x0) goto LAB_001ef33b;
      memcpy(pOVar3,p_header_data + 6,(ulong)uVar10);
      poVar9->m_data_size = uVar10;
      poVar7->m_nb_mct_records = poVar7->m_nb_mct_records + 1;
    }
    else {
      fmt = "Cannot take in charge mct data within multiple MCT records\n";
LAB_001ef378:
      opj_event_msg_v2(p_manager,2,fmt);
    }
    oVar6 = 1;
  }
  return oVar6;
}

Assistant:

opj_bool j2k_read_mct (	opj_j2k_v2_t *p_j2k,
						OPJ_BYTE * p_header_data,
						OPJ_UINT32 p_header_size,
						struct opj_event_mgr * p_manager )
{
	OPJ_UINT32 i;
	opj_tcp_v2_t *l_tcp = 00;
	OPJ_UINT32 l_tmp;
	OPJ_UINT32 l_indix;
	opj_mct_data_t * l_mct_data;

	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);

	l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
			&p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
			p_j2k->m_specific_param.m_decoder.m_default_tcp;

	if (p_header_size < 2) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}

	/* first marker */
	opj_read_bytes(p_header_data,&l_tmp,2);				/* Zmct */
	p_header_data += 2;
	if (l_tmp != 0) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge mct data within multiple MCT records\n");
		return OPJ_TRUE;
	}

	if(p_header_size <= 6) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}

	/* Imct -> no need for other values, take the first, type is double with decorrelation x0000 1101 0000 0000*/
	opj_read_bytes(p_header_data,&l_tmp,2); 			/* Imct */
	p_header_data += 2;

	l_indix = l_tmp & 0xff;
	l_mct_data = l_tcp->m_mct_records;

	for (i=0;i<l_tcp->m_nb_mct_records;++i) {
		if (l_mct_data->m_index == l_indix) {
			break;
		}
		++l_mct_data;
	}

	/* NOT FOUND */
	if (i == l_tcp->m_nb_mct_records) {
		if (l_tcp->m_nb_mct_records == l_tcp->m_nb_max_mct_records) {
			l_tcp->m_nb_max_mct_records += J2K_MCT_DEFAULT_NB_RECORDS;

			l_tcp->m_mct_records = (opj_mct_data_t*)opj_realloc(l_tcp->m_mct_records,l_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
			if(! l_tcp->m_mct_records) {
				opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
				return OPJ_FALSE;
			}

			l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
			memset(l_mct_data ,0,(l_tcp->m_nb_max_mct_records - l_tcp->m_nb_mct_records) * sizeof(opj_mct_data_t));
		}

		l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
	}

	if (l_mct_data->m_data) {
		opj_free(l_mct_data->m_data);
		l_mct_data->m_data = 00;
	}

	l_mct_data->m_index = l_indix;
	l_mct_data->m_array_type = (J2K_MCT_ARRAY_TYPE)((l_tmp  >> 8) & 3);
	l_mct_data->m_element_type = (J2K_MCT_ELEMENT_TYPE)((l_tmp  >> 10) & 3);

	opj_read_bytes(p_header_data,&l_tmp,2);				/* Ymct */
	p_header_data+=2;
	if (l_tmp != 0) {
		opj_event_msg_v2(p_manager, EVT_WARNING, "Cannot take in charge multiple MCT markers\n");
		return OPJ_TRUE;
	}

	p_header_size -= 6;

	l_mct_data->m_data = (OPJ_BYTE*)opj_malloc(p_header_size);
	if (! l_mct_data->m_data) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading MCT marker\n");
		return OPJ_FALSE;
	}
	memcpy(l_mct_data->m_data,p_header_data,p_header_size);

	l_mct_data->m_data_size = p_header_size;
	++l_tcp->m_nb_mct_records;

	return OPJ_TRUE;
}